

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_strauss_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  uint64_t *puVar1;
  undefined8 *puVar2;
  size_t checkpoint;
  secp256k1_gej *a;
  secp256k1_scalar *na;
  secp256k1_fe *psVar3;
  secp256k1_ge *psVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  secp256k1_strauss_state state;
  secp256k1_ge point;
  
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[4] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  iVar5 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    a = (secp256k1_gej *)secp256k1_scratch_alloc(error_callback,scratch,n_points << 7);
    na = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,n_points << 5);
    psVar3 = (secp256k1_fe *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x140);
    state.aux = psVar3;
    psVar4 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x2c0);
    sVar7 = n_points;
    state.pre_a = psVar4;
    state.ps = (secp256k1_strauss_point_state *)
               secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x410);
    auVar8._0_4_ = -(uint)((int)((ulong)a >> 0x20) == 0 && (int)a == 0);
    auVar8._4_4_ = -(uint)((int)na == 0 && (int)((ulong)na >> 0x20) == 0);
    auVar8._8_4_ = -(uint)((int)((ulong)psVar3 >> 0x20) == 0 && (int)psVar3 == 0);
    auVar8._12_4_ = -(uint)((int)psVar4 == 0 && (int)((ulong)psVar4 >> 0x20) == 0);
    iVar5 = movmskps((int)sVar7,auVar8);
    if (iVar5 == 0 && state.ps != (secp256k1_strauss_point_state *)0x0) {
      lVar6 = 0;
      for (sVar7 = 0; n_points != sVar7; sVar7 = sVar7 + 1) {
        iVar5 = (*cb)((secp256k1_scalar *)((long)na->d + lVar6),&point,cb_offset + sVar7,cbdata);
        if (iVar5 == 0) goto LAB_00132b80;
        *(int *)((long)(&a->z + 1) + lVar6 * 4) = point.infinity;
        puVar1 = (uint64_t *)((long)(a->x).n + lVar6 * 4);
        *puVar1 = point.x.n[0];
        puVar1[1] = point.x.n[1];
        puVar1 = (uint64_t *)((long)(a->x).n + lVar6 * 4 + 0x10);
        *puVar1 = point.x.n[2];
        puVar1[1] = point.x.n[3];
        *(uint64_t *)((long)(a->y).n + lVar6 * 4 + -8) = point.x.n[4];
        puVar1 = (uint64_t *)((long)(a->y).n + lVar6 * 4);
        *puVar1 = point.y.n[0];
        puVar1[1] = point.y.n[1];
        puVar1 = (uint64_t *)((long)(a->y).n + lVar6 * 4 + 0x10);
        *puVar1 = point.y.n[2];
        puVar1[1] = point.y.n[3];
        *(uint64_t *)((long)(a->z).n + lVar6 * 4 + -8) = point.y.n[4];
        *(undefined8 *)((long)(a->z).n + lVar6 * 4) = 1;
        puVar2 = (undefined8 *)((long)(a->z).n + lVar6 * 4 + 8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)(a->z).n + lVar6 * 4 + 0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar6 = lVar6 + 0x20;
      }
      secp256k1_ecmult_strauss_wnaf(&state,r,n_points,a,na,inp_g_sc);
      secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
      iVar5 = 1;
    }
    else {
LAB_00132b80:
      secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int secp256k1_ecmult_strauss_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    secp256k1_gej* points;
    secp256k1_scalar* scalars;
    struct secp256k1_strauss_state state;
    size_t i;
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }

    /* We allocate STRAUSS_SCRATCH_OBJECTS objects on the scratch space. If these
     * allocations change, make sure to update the STRAUSS_SCRATCH_OBJECTS
     * constant and strauss_scratch_size accordingly. */
    points = (secp256k1_gej*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_gej));
    scalars = (secp256k1_scalar*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_scalar));
    state.aux = (secp256k1_fe*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_fe));
    state.pre_a = (secp256k1_ge*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_ge));
    state.ps = (struct secp256k1_strauss_point_state*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(struct secp256k1_strauss_point_state));

    if (points == NULL || scalars == NULL || state.aux == NULL || state.pre_a == NULL || state.ps == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    for (i = 0; i < n_points; i++) {
        secp256k1_ge point;
        if (!cb(&scalars[i], &point, i+cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        secp256k1_gej_set_ge(&points[i], &point);
    }
    secp256k1_ecmult_strauss_wnaf(&state, r, n_points, points, scalars, inp_g_sc);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}